

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::startThreads(FastText *this)

{
  element_type *peVar1;
  element_type *this_00;
  vector<std::thread,_std::allocator<std::thread>_> *this_01;
  long in_RDI;
  float fVar2;
  ostream *in_stack_00000010;
  real in_stack_00000018;
  real in_stack_0000001c;
  FastText *in_stack_00000020;
  int32_t i_1;
  real progress;
  int64_t ntokens;
  int32_t i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  __atomic_base<long> *in_stack_ffffffffffffff68;
  __atomic_base<long> *in_stack_ffffffffffffff70;
  type *__f;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar3;
  int iVar4;
  int local_64;
  duration<long,std::ratio<1l,1000l>> local_60 [8];
  vector<std::thread,_std::allocator<std::thread>_> *local_58;
  int local_48;
  int local_38;
  vector<std::thread,_std::allocator<std::thread>_> local_28;
  undefined8 local_10;
  
  local_10 = std::chrono::_V2::steady_clock::now();
  *(undefined8 *)(in_RDI + 0x60) = local_10;
  std::__atomic_base<long>::operator=
            (in_stack_ffffffffffffff70,(__int_type)in_stack_ffffffffffffff68);
  std::atomic<float>::operator=
            ((atomic<float> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c);
  __f = (type *)&local_28;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x170abf);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x170ac9);
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(size_type)__f);
  for (local_38 = 0; iVar3 = local_38,
      peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x170af3), iVar3 < peVar1->thread; local_38 = local_38 + 1) {
    local_48 = local_38;
    std::thread::thread<fasttext::FastText::startThreads()::__0,,void>
              ((thread *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),__f);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (value_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::thread::~thread((thread *)0x170b40);
  }
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x170b8b);
  this_01 = (vector<std::thread,_std::allocator<std::thread>_> *)Dictionary::ntokens(this_00);
  local_58 = this_01;
  while( true ) {
    in_stack_ffffffffffffff68 =
         (__atomic_base<long> *)std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffff68)
    ;
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x170bc1);
    if ((long)peVar1->epoch * (long)local_58 <= (long)in_stack_ffffffffffffff68) break;
    local_64 = 10000;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_60,&local_64);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    fVar2 = std::atomic::operator_cast_to_float((atomic<float> *)0x170c0f);
    if ((0.0 <= fVar2) &&
       (peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x170c27), 1 < peVar1->verbose)) {
      std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffff68);
      std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x170c57);
      std::operator<<((ostream *)&std::cerr,"\r");
      std::atomic::operator_cast_to_float((atomic<float> *)0x170ca8);
      printInfo(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000010);
    }
  }
  iVar3 = 0;
  while (iVar4 = iVar3,
        peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x170ce6), iVar3 < peVar1->thread) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_28,(long)iVar4);
    std::thread::join();
    iVar3 = iVar4 + 1;
  }
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x170d27);
  if (0 < peVar1->verbose) {
    std::operator<<((ostream *)&std::cerr,"\r");
    std::atomic::operator_cast_to_float((atomic<float> *)0x170d53);
    printInfo(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000010);
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(this_01);
  return;
}

Assistant:

void FastText::startThreads() {
  start_ = std::chrono::steady_clock::now();
  tokenCount_ = 0;
  loss_ = -1;
  std::vector<std::thread> threads;
  threads.reserve(args_->thread);
  for (int32_t i = 0; i < args_->thread; i++) {
    threads.push_back(std::thread([=]() { trainThread(i); }));
  }
  const int64_t ntokens = dict_->ntokens();
  // Same condition as trainThread
  while (tokenCount_ < args_->epoch * ntokens) {
    std::this_thread::sleep_for(std::chrono::milliseconds(10000));
    if (loss_ >= 0 && args_->verbose > 1) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      std::cerr << "\r";
      printInfo(progress, loss_, std::cerr);
    }
  }
  for (int32_t i = 0; i < args_->thread; i++) {
    threads[i].join();
  }
  if (args_->verbose > 0) {
    std::cerr << "\r";
    printInfo(1.0, loss_, std::cerr);
    std::cerr << std::endl;
  }
}